

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::UdpDeclarationSyntax::UdpDeclarationSyntax
          (UdpDeclarationSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes
          ,Token primitive,Token name,UdpPortListSyntax *portList,UdpBodySyntax *body,
          Token endprimitive,NamedBlockClauseSyntax *endBlockName)

{
  UdpPortListSyntax *pUVar1;
  UdpBodySyntax *pUVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  UdpBodySyntax *local_38;
  
  uVar3 = primitive._0_8_;
  uVar4 = name._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,UdpDeclaration,attributes);
  (this->primitive).kind = (short)uVar3;
  (this->primitive).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->primitive).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->primitive).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->primitive).info = primitive.info;
  (this->name).kind = (short)uVar4;
  (this->name).field_0x2 = (char)((ulong)uVar4 >> 0x10);
  (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar4 >> 0x18);
  (this->name).rawLen = (int)((ulong)uVar4 >> 0x20);
  (this->name).info = name.info;
  local_38 = (UdpBodySyntax *)portList;
  not_null<slang::syntax::UdpPortListSyntax*>::not_null<slang::syntax::UdpPortListSyntax*,void>
            ((not_null<slang::syntax::UdpPortListSyntax*> *)&this->portList,
             (UdpPortListSyntax **)&local_38);
  local_38 = body;
  not_null<slang::syntax::UdpBodySyntax*>::not_null<slang::syntax::UdpBodySyntax*,void>
            ((not_null<slang::syntax::UdpBodySyntax*> *)&this->body,&local_38);
  (this->endprimitive).kind = endprimitive.kind;
  (this->endprimitive).field_0x2 = endprimitive._2_1_;
  (this->endprimitive).numFlags = (NumericTokenFlags)endprimitive.numFlags.raw;
  (this->endprimitive).rawLen = endprimitive.rawLen;
  (this->endprimitive).info = endprimitive.info;
  this->endBlockName = endBlockName;
  pUVar1 = not_null<slang::syntax::UdpPortListSyntax_*>::get(&this->portList);
  (pUVar1->super_SyntaxNode).parent = (SyntaxNode *)this;
  pUVar2 = not_null<slang::syntax::UdpBodySyntax_*>::get(&this->body);
  (pUVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (this->endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (this->endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

UdpDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token primitive, Token name, UdpPortListSyntax& portList, UdpBodySyntax& body, Token endprimitive, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::UdpDeclaration, attributes), primitive(primitive), name(name), portList(&portList), body(&body), endprimitive(endprimitive), endBlockName(endBlockName) {
        this->portList->parent = this;
        this->body->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }